

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O2

void ConvexDecomposition::b2bfix(cbtHullTriangle *s,cbtHullTriangle *t)

{
  int a;
  int iVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  cbtHullTriangle **ppcVar5;
  ulong uVar6;
  int iVar7;
  uint uVar8;
  bool bVar9;
  
  iVar7 = 3;
  uVar2 = 0;
  while( true ) {
    bVar9 = iVar7 == 0;
    iVar7 = iVar7 + -1;
    if (bVar9) {
      return;
    }
    uVar8 = uVar2 + 1;
    uVar6 = (ulong)uVar8;
    if (uVar8 == 3) {
      uVar6 = 0;
    }
    iVar3 = uVar2 - 1;
    if (uVar2 == 0) {
      iVar3 = 2;
    }
    a = (&(s->super_int3).x)[uVar6];
    iVar3 = (&(s->super_int3).x)[iVar3];
    piVar4 = cbtHullTriangle::neib(s,a,iVar3);
    ppcVar5 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                        ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,*piVar4);
    piVar4 = cbtHullTriangle::neib(*ppcVar5,iVar3,a);
    if (*piVar4 != s->id) break;
    piVar4 = cbtHullTriangle::neib(t,a,iVar3);
    ppcVar5 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                        ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,*piVar4);
    piVar4 = cbtHullTriangle::neib(*ppcVar5,iVar3,a);
    if (*piVar4 != t->id) {
      __assert_fail("tris[t->neib(a,b)]->neib(b,a) == t->id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                    ,0x950,"void ConvexDecomposition::b2bfix(cbtHullTriangle *, cbtHullTriangle *)")
      ;
    }
    piVar4 = cbtHullTriangle::neib(t,iVar3,a);
    iVar1 = *piVar4;
    piVar4 = cbtHullTriangle::neib(s,a,iVar3);
    ppcVar5 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                        ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,*piVar4);
    piVar4 = cbtHullTriangle::neib(*ppcVar5,iVar3,a);
    *piVar4 = iVar1;
    piVar4 = cbtHullTriangle::neib(s,a,iVar3);
    iVar1 = *piVar4;
    piVar4 = cbtHullTriangle::neib(t,iVar3,a);
    ppcVar5 = Array<ConvexDecomposition::cbtHullTriangle_*>::operator[]
                        ((Array<ConvexDecomposition::cbtHullTriangle_*> *)tris,*piVar4);
    piVar4 = cbtHullTriangle::neib(*ppcVar5,a,iVar3);
    *piVar4 = iVar1;
    uVar2 = uVar8;
  }
  __assert_fail("tris[s->neib(a,b)]->neib(b,a) == s->id",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x94f,"void ConvexDecomposition::b2bfix(cbtHullTriangle *, cbtHullTriangle *)");
}

Assistant:

void b2bfix(cbtHullTriangle* s,cbtHullTriangle*t)
{
	int i;
	for(i=0;i<3;i++) 
	{
		int i1=(i+1)%3;
		int i2=(i+2)%3;
		int a = (*s)[i1];
		int b = (*s)[i2];
		assert(tris[s->neib(a,b)]->neib(b,a) == s->id);
		assert(tris[t->neib(a,b)]->neib(b,a) == t->id);
		tris[s->neib(a,b)]->neib(b,a) = t->neib(b,a);
		tris[t->neib(b,a)]->neib(a,b) = s->neib(a,b);
	}
}